

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O1

Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *
LoadAddrman(Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *__return_storage_ptr__
           ,NetGroupManager *netgroupman,ArgsManager *args)

{
  uint32_t *puVar1;
  long lVar2;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  __single_object _Var3;
  bool deterministic_00;
  int64_t iVar4;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this;
  long lVar5;
  FILE *file;
  CChainParams *pCVar6;
  long lVar7;
  runtime_error *this_00;
  uint uVar8;
  size_t sVar9;
  code *pcVar10;
  pointer_____offset_0x10___ *ppuVar11;
  uint consistency_check_ratio;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  string_view source_file;
  string_view logging_function;
  _Head_base<0UL,_AddrMan_*,_false> local_2e8;
  undefined8 uStack_2e0;
  __single_object addrman;
  bool deterministic;
  int check_addrman;
  MessageStartChars pchMsgTmp;
  AutoFile filein;
  path local_138;
  path path_addr;
  uint256 local_e8;
  uint256 hashTmp;
  HashVerifier<AutoFile> verifier;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = verifier.super_HashWriter.ctx.s + 4;
  verifier.super_HashWriter.ctx.s._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&verifier,"-checkaddrman","");
  iVar4 = ArgsManager::GetIntArg(args,(string *)&verifier,0);
  uVar8 = 1000000;
  if ((int)(uint)iVar4 < 1000000) {
    uVar8 = (uint)iVar4;
  }
  consistency_check_ratio = 0;
  if (0 < (int)uVar8) {
    consistency_check_ratio = uVar8;
  }
  if ((uint32_t *)verifier.super_HashWriter.ctx.s._0_8_ != puVar1) {
    operator_delete((void *)verifier.super_HashWriter.ctx.s._0_8_,
                    verifier.super_HashWriter.ctx.s._16_8_ + 1);
  }
  verifier.super_HashWriter.ctx.s._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&verifier,"addrman","");
  deterministic_00 = HasTestOption(args,(string *)&verifier);
  if ((uint32_t *)verifier.super_HashWriter.ctx.s._0_8_ != puVar1) {
    operator_delete((void *)verifier.super_HashWriter.ctx.s._0_8_,
                    verifier.super_HashWriter.ctx.s._16_8_ + 1);
  }
  this.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  sVar9 = (size_t)consistency_check_ratio;
  AddrMan::AddrMan((AddrMan *)
                   this.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,netgroupman,deterministic_00
                   ,consistency_check_ratio);
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  lVar5 = std::chrono::_V2::steady_clock::now();
  ArgsManager::GetDataDir((path *)&local_138,args,true);
  std::filesystem::__cxx11::path::_M_append(&local_138,9,"peers.dat");
  std::filesystem::__cxx11::path::path(&path_addr.super_path,&local_138);
  std::filesystem::__cxx11::path::~path(&local_138);
  _Var3 = addrman;
  file = fsbridge::fopen((char *)&path_addr.super_path,"rb");
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)uStack_2e0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_2e8._M_head_impl;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       (pointer)addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  AutoFile::AutoFile(&filein,(FILE *)file,data_xor);
  if (filein.m_file == (FILE *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(8);
    *(undefined ***)this_00 = &PTR__exception_013b3560;
    pcVar10 = std::exception::~exception;
    ppuVar11 = &(anonymous_namespace)::DbNotFoundError::typeinfo;
  }
  else {
    CSHA256::CSHA256((CSHA256 *)&verifier);
    verifier.m_source = &filein;
    AutoFile::read(&filein,(int)&pchMsgTmp,(void *)0x4,sVar9);
    CSHA256::Write((CSHA256 *)&verifier,pchMsgTmp._M_elems,4);
    pCVar6 = Params();
    sVar9 = (size_t)(uint)pchMsgTmp._M_elems;
    if (pchMsgTmp._M_elems == *&(pCVar6->pchMessageStart)._M_elems) {
      AddrMan::Unserialize<HashVerifier<AutoFile>>
                ((AddrMan *)
                 _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                 super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&verifier);
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      AutoFile::read(&filein,(int)&hashTmp,(void *)0x20,sVar9);
      HashWriter::GetHash(&local_e8,&verifier.super_HashWriter);
      auVar13[0] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x10] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar13[1] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x11] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar13[2] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x12] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar13[3] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x13] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar13[4] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x14] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar13[5] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x15] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar13[6] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x16] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar13[7] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x17] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar13[8] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x18] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar13[9] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x19] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar13[10] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar13[0xb] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar13[0xc] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar13[0xd] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar13[0xe] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar13[0xf] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar12[0] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0]);
      auVar12[1] = -(local_e8.super_base_blob<256U>.m_data._M_elems[1] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[1]);
      auVar12[2] = -(local_e8.super_base_blob<256U>.m_data._M_elems[2] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[2]);
      auVar12[3] = -(local_e8.super_base_blob<256U>.m_data._M_elems[3] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[3]);
      auVar12[4] = -(local_e8.super_base_blob<256U>.m_data._M_elems[4] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[4]);
      auVar12[5] = -(local_e8.super_base_blob<256U>.m_data._M_elems[5] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[5]);
      auVar12[6] = -(local_e8.super_base_blob<256U>.m_data._M_elems[6] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[6]);
      auVar12[7] = -(local_e8.super_base_blob<256U>.m_data._M_elems[7] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[7]);
      auVar12[8] = -(local_e8.super_base_blob<256U>.m_data._M_elems[8] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[8]);
      auVar12[9] = -(local_e8.super_base_blob<256U>.m_data._M_elems[9] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[9]);
      auVar12[10] = -(local_e8.super_base_blob<256U>.m_data._M_elems[10] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[10]);
      auVar12[0xb] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0xb] ==
                      hashTmp.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar12[0xc] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0xc] ==
                      hashTmp.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar12[0xd] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0xd] ==
                      hashTmp.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar12[0xe] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0xe] ==
                      hashTmp.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar12[0xf] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0xf] ==
                      hashTmp.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar12 = auVar12 & auVar13;
      if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
        AutoFile::~AutoFile(&filein);
        verifier.super_HashWriter.ctx.s._0_8_ =
             AddrMan::Size((AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                           (optional<Network>)0x0,(optional<bool>)0x0);
        lVar7 = std::chrono::_V2::steady_clock::now();
        filein.m_file = (FILE *)((lVar7 - lVar5) / 1000000);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
        ;
        source_file._M_len = 0x5a;
        logging_function._M_str = "LoadAddrman";
        logging_function._M_len = 0xb;
        LogPrintFormatInternal<unsigned_long,long>
                  (logging_function,source_file,0xca,ALL,Info,(ConstevalFormatString<2U>)0xf8e81f,
                   (unsigned_long *)&verifier,(long *)&filein);
        _Var3 = addrman;
        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
        super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
             (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
             (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)0x0;
        *(__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> *)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_>
          .super__Move_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Copy_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Move_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Variant_storage_alias<bilingual_str,_std::unique_ptr<AddrMan>_> =
             _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
        local_2e8._M_head_impl = (AddrMan *)0x0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_>
                 .super__Move_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Copy_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Move_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Variant_storage_alias<bilingual_str,_std::unique_ptr<AddrMan>_> + 0x40) =
             '\x01';
        std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
                  ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)&local_2e8);
        std::filesystem::__cxx11::path::~path(&path_addr.super_path);
        std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          return __return_storage_ptr__;
        }
        goto LAB_00854efc;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Checksum mismatch, data corrupted");
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Invalid network magic number");
    }
    pcVar10 = std::runtime_error::~runtime_error;
    ppuVar11 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    __cxa_throw(this_00,ppuVar11,pcVar10);
  }
LAB_00854efc:
  __stack_chk_fail();
}

Assistant:

util::Result<std::unique_ptr<AddrMan>> LoadAddrman(const NetGroupManager& netgroupman, const ArgsManager& args)
{
    auto check_addrman = std::clamp<int32_t>(args.GetIntArg("-checkaddrman", DEFAULT_ADDRMAN_CONSISTENCY_CHECKS), 0, 1000000);
    bool deterministic = HasTestOption(args, "addrman"); // use a deterministic addrman only for tests

    auto addrman{std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman)};

    const auto start{SteadyClock::now()};
    const auto path_addr{args.GetDataDirNet() / "peers.dat"};
    try {
        DeserializeFileDB(path_addr, *addrman);
        LogPrintf("Loaded %i addresses from peers.dat  %dms\n", addrman->Size(), Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
    } catch (const DbNotFoundError&) {
        // Addrman can be in an inconsistent state after failure, reset it
        addrman = std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman);
        LogPrintf("Creating peers.dat because the file was not found (%s)\n", fs::quoted(fs::PathToString(path_addr)));
        DumpPeerAddresses(args, *addrman);
    } catch (const InvalidAddrManVersionError&) {
        if (!RenameOver(path_addr, (fs::path)path_addr + ".bak")) {
            return util::Error{strprintf(_("Failed to rename invalid peers.dat file. Please move or delete it and try again."))};
        }
        // Addrman can be in an inconsistent state after failure, reset it
        addrman = std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman);
        LogPrintf("Creating new peers.dat because the file version was not compatible (%s). Original backed up to peers.dat.bak\n", fs::quoted(fs::PathToString(path_addr)));
        DumpPeerAddresses(args, *addrman);
    } catch (const std::exception& e) {
        return util::Error{strprintf(_("Invalid or corrupt peers.dat (%s). If you believe this is a bug, please report it to %s. As a workaround, you can move the file (%s) out of the way (rename, move, or delete) to have a new one created on the next start."),
                                     e.what(), PACKAGE_BUGREPORT, fs::quoted(fs::PathToString(path_addr)))};
    }
    return addrman;
}